

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

void quantize(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  FastText fasttext;
  Args a;
  _Any_data local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  FastText local_228;
  Args local_1a8;
  
  ::fasttext::Args::Args(&local_1a8);
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x41) {
    printQuantizeUsage();
    ::fasttext::Args::printHelp(&local_1a8);
    exit(1);
  }
  ::fasttext::Args::parseArgs(&local_1a8,args);
  ::fasttext::FastText::FastText(&local_228);
  local_248._M_unused._M_object = &local_238;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,local_1a8.output._M_dataplus._M_p,
             local_1a8.output._M_dataplus._M_p + local_1a8.output._M_string_length);
  std::__cxx11::string::append(local_248._M_pod_data);
  ::fasttext::FastText::loadModel(&local_228,(string *)&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_unused._0_8_ != &local_238) {
    operator_delete(local_248._M_unused._M_object,local_238._M_allocated_capacity + 1);
  }
  local_238._M_allocated_capacity = 0;
  local_238._8_8_ = 0;
  local_248._M_unused._M_object = (void *)0x0;
  local_248._8_8_ = 0;
  ::fasttext::FastText::quantize(&local_228,&local_1a8,(TrainCallback *)&local_248);
  if ((code *)local_238._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_238._M_allocated_capacity)(&local_248,&local_248,3);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_248,
                 &local_1a8.output,".ftz");
  ::fasttext::FastText::saveModel(&local_228,(string *)&local_248);
  std::__cxx11::string::~string((string *)local_248._M_pod_data);
  exit(0);
}

Assistant:

void quantize(const std::vector<std::string>& args) {
  Args a = Args();
  if (args.size() < 3) {
    printQuantizeUsage();
    a.printHelp();
    exit(EXIT_FAILURE);
  }
  a.parseArgs(args);
  FastText fasttext;
  // parseArgs checks if a->output is given.
  fasttext.loadModel(a.output + ".bin");
  fasttext.quantize(a);
  fasttext.saveModel(a.output + ".ftz");
  exit(0);
}